

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
          (WireFormatTest<proto2_unittest::TestAllTypes> *this,TestMessageSetExtension1 *message,
          CodedOutputStream *coded_output)

{
  int32_t iVar1;
  uint32_t value;
  TestMessageSet *pTVar2;
  CodedOutputStream *coded_output_local;
  TestMessageSetExtension1 *message_local;
  WireFormatTest<proto2_unittest::TestAllTypes> *this_local;
  
  WireFormatLite::WriteTag(0xf,WIRETYPE_VARINT,coded_output);
  iVar1 = proto2_unittest::TestMessageSetExtension1::i(message);
  protobuf::io::CodedOutputStream::WriteVarint64(coded_output,(long)iVar1);
  WireFormatLite::WriteTag(0x10,WIRETYPE_LENGTH_DELIMITED,coded_output);
  pTVar2 = proto2_unittest::TestMessageSetExtension1::recursive(message);
  value = proto2_wireformat_unittest::TestMessageSet::GetCachedSize(pTVar2);
  protobuf::io::CodedOutputStream::WriteVarint32(coded_output,value);
  pTVar2 = proto2_unittest::TestMessageSetExtension1::recursive(message);
  SerializeReverseOrder(this,pTVar2,coded_output);
  return;
}

Assistant:

void SerializeReverseOrder(const TestMessageSetExtension1& message,
                             io::CodedOutputStream* coded_output) {
    WireFormatLite::WriteTag(15,  // i
                             WireFormatLite::WIRETYPE_VARINT, coded_output);
    coded_output->WriteVarint64(message.i());
    WireFormatLite::WriteTag(16,  // recursive
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                             coded_output);
    coded_output->WriteVarint32(message.recursive().GetCachedSize());
    SerializeReverseOrder(message.recursive(), coded_output);
  }